

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

void __thiscall quic::Bbr2ProbeBwMode::RaiseInflightHighSlope(Bbr2ProbeBwMode *this)

{
  unsigned_long *puVar1;
  QuicByteCount QVar2;
  ulong local_30;
  uint64_t probe_up_bytes;
  unsigned_long local_20;
  ulong local_18;
  uint64_t growth_this_round;
  Bbr2ProbeBwMode *this_local;
  
  local_18 = (ulong)(1 << ((byte)(this->cycle_).probe_up_rounds & 0x1f));
  local_20 = (this->cycle_).probe_up_rounds + 1;
  probe_up_bytes = 0x1e;
  growth_this_round = (uint64_t)this;
  puVar1 = std::min<unsigned_long>(&local_20,&probe_up_bytes);
  (this->cycle_).probe_up_rounds = *puVar1;
  QVar2 = Bbr2Sender::GetCongestionWindow((this->super_Bbr2ModeBase).sender_);
  local_30 = QVar2 / local_18;
  puVar1 = std::max<unsigned_long>(&local_30,&kDefaultTCPMSS);
  (this->cycle_).probe_up_bytes = *puVar1;
  return;
}

Assistant:

void Bbr2ProbeBwMode::RaiseInflightHighSlope() {
 /* DCHECK_EQ(cycle_.phase, CyclePhase::PROBE_UP);*/
  uint64_t growth_this_round = 1 << cycle_.probe_up_rounds;
  // The number 30 below means |growth_this_round| is capped at 1G and the lower
  // bound of |probe_up_bytes| is (practically) 1 mss, at this speed inflight_hi
  // grows by approximately 1 packet per packet acked.
  cycle_.probe_up_rounds = std::min<uint64_t>(cycle_.probe_up_rounds + 1, 30);
  uint64_t probe_up_bytes = sender_->GetCongestionWindow() / growth_this_round;
  cycle_.probe_up_bytes =
      std::max<QuicByteCount>(probe_up_bytes, kDefaultTCPMSS);
  //QUIC_DVLOG(3) << sender_ << " Rasing inflight_hi slope. probe_up_rounds:"
  //              << cycle_.probe_up_rounds
  //              << ", probe_up_bytes:" << cycle_.probe_up_bytes;
}